

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::Cluster::HasBlockEntries(Segment *pSegment,longlong off,longlong *pos,long *len)

{
  IMkvReader *pReader;
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  longlong avail;
  longlong total;
  long local_48;
  ulong local_40;
  ulong local_38;
  char cVar6;
  
  if (pSegment == (Segment *)0x0) {
    __assert_fail("pSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ad1,
                  "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                 );
  }
  if (off < 0) {
    __assert_fail("off >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ad2,
                  "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                 );
  }
  pReader = pSegment->m_pReader;
  iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_40,&local_48);
  if (iVar2 < 0) {
    return (long)iVar2;
  }
  if ((long)local_40 < local_48 && -1 < (long)local_40) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1add,
                  "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                 );
  }
  lVar9 = off + pSegment->m_start;
  *pos = lVar9;
  if ((long)local_40 <= lVar9 && -1 < (long)local_40) {
    return 0;
  }
  if (pSegment->m_size < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    uVar7 = pSegment->m_size + pSegment->m_start;
  }
  if (local_48 <= lVar9) goto LAB_00111381;
  uVar3 = GetUIntLength(pReader,lVar9,len);
  uVar8 = 0xffffffffffffffff;
  bVar11 = uVar3 != 0;
  if (((long)uVar3 < 0) || (uVar10 = 0xfffffffffffffffd, uVar3 = uVar10, bVar11)) {
LAB_00111106:
    uVar8 = 0xffffffffffffffff;
    bVar11 = false;
  }
  else {
    if ((-1 < (long)uVar7) && ((long)uVar7 < *len + *pos)) {
      uVar3 = 0xfffffffffffffffe;
      goto LAB_00111106;
    }
    if (((long)local_40 < 0) || (*len + *pos <= (long)local_40)) {
      if (local_48 < *len + *pos) goto LAB_00111106;
      uVar3 = ReadID(pReader,*pos,len);
      if (-1 < (long)uVar3) {
        uVar8 = 0xffffffffffffffff;
        if (uVar3 != 0x1f43b675) {
          bVar11 = false;
          uVar3 = 0xffffffffffffffff;
          goto LAB_00111108;
        }
        lVar9 = *pos + *len;
        *pos = lVar9;
        if (local_48 <= lVar9) {
          *len = 1;
          uVar3 = uVar10;
          goto LAB_00111106;
        }
        uVar8 = GetUIntLength(pReader,lVar9,len);
        uVar3 = uVar8;
        if ((-1 < (long)uVar8) && (uVar3 = uVar10, uVar8 == 0)) {
          if (((long)uVar7 < 0) || (*len + *pos <= (long)uVar7)) {
            if (((long)local_40 < 0) || (*len + *pos <= (long)local_40)) {
              if (*len + *pos <= local_48) {
                uVar3 = ReadUInt(pReader,*pos,len);
                if ((long)uVar3 < 0) {
                  bVar11 = false;
                }
                else if (uVar3 == 0) {
                  bVar11 = false;
                  uVar3 = 0;
                }
                else {
                  lVar9 = *len;
                  lVar4 = *pos + lVar9;
                  *pos = lVar4;
                  if ((-1L << ((char)lVar9 * '\a' & 0x3fU) ^ uVar3) != 0xffffffffffffffff) {
                    uVar8 = lVar4 + uVar3;
                    if ((long)uVar8 < 0) {
                      __assert_fail("cluster_stop >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                    ,0x1b32,
                                    "static long mkvparser::Cluster::HasBlockEntries(const Segment *, long long, long long &, long &)"
                                   );
                    }
                    if (uVar8 <= uVar7) {
                      uVar3 = 0;
                    }
                    else {
                      uVar3 = 0xfffffffffffffffe;
                    }
                    bVar11 = uVar8 <= uVar7 && uVar8 <= local_40;
                    goto LAB_00111108;
                  }
                  bVar11 = true;
                }
                uVar8 = 0xffffffffffffffff;
                goto LAB_00111108;
              }
            }
            else {
              uVar3 = 0;
            }
          }
          else {
            uVar3 = 0xfffffffffffffffe;
          }
        }
      }
      bVar11 = false;
      uVar8 = 0xffffffffffffffff;
    }
    else {
      bVar11 = false;
      uVar3 = 0;
    }
  }
LAB_00111108:
  if (!bVar11) {
    return uVar3;
  }
  lVar9 = *pos;
  if (-1 < (long)uVar8 && (long)uVar8 <= lVar9) {
    return 0;
  }
  while (lVar9 < local_48) {
    uVar7 = GetUIntLength(pReader,lVar9,len);
    cVar5 = '\x01';
    cVar6 = '\x01';
    bVar11 = uVar7 == 0;
    cVar1 = cVar5;
    if ((-1 < (long)uVar7) && (uVar10 = 0xfffffffffffffffd, uVar7 = uVar10, cVar1 = cVar6, bVar11))
    {
      if ((-1 < (long)uVar8) && ((long)uVar8 < *len + *pos)) goto LAB_00111182;
      if ((*len + *pos <= local_48) &&
         (uVar7 = ReadID(pReader,*pos,len), cVar1 = cVar5, -1 < (long)uVar7)) {
        if ((uVar7 == 0x1c53bb6b) || (uVar7 == 0x1f43b675)) {
          uVar7 = 0;
          cVar1 = cVar6;
        }
        else {
          lVar9 = *pos + *len;
          *pos = lVar9;
          if (-1 < (long)uVar8 && (long)uVar8 <= lVar9) goto LAB_00111182;
          if (lVar9 < local_48) {
            local_38 = uVar7;
            uVar7 = GetUIntLength(pReader,lVar9,len);
            bVar11 = uVar7 == 0;
            if ((-1 < (long)uVar7) && (uVar7 = uVar10, cVar1 = cVar6, bVar11)) {
              if (((long)uVar8 < 0) || (*len + *pos <= (long)uVar8)) {
                if ((*len + *pos <= local_48) &&
                   (uVar7 = ReadUInt(pReader,*pos,len), cVar1 = cVar5, -1 < (long)uVar7)) {
                  lVar9 = *len;
                  lVar4 = *pos + lVar9;
                  *pos = lVar4;
                  if (-1 < (long)uVar8 && (long)uVar8 < lVar4) goto LAB_00111182;
                  if (uVar7 == 0) {
                    uVar7 = uVar3;
                    cVar1 = '\x03';
                  }
                  else if (((-1L << ((char)lVar9 * '\a' & 0x3fU) ^ uVar7) == 0xffffffffffffffff) ||
                          (lVar4 = lVar4 + uVar7, -1 < (long)uVar8 && (long)uVar8 < lVar4)) {
                    uVar7 = 0xfffffffffffffffe;
                  }
                  else {
                    uVar7 = 1;
                    if ((local_38 != 0xa0) && (cVar1 = cVar6, local_38 != 0xa3)) {
                      *pos = lVar4;
                      cVar1 = (long)uVar8 < lVar4 && -1 < (long)uVar8;
                      uVar7 = uVar3;
                      if ((long)uVar8 < lVar4 && -1 < (long)uVar8) {
                        uVar7 = 0xfffffffffffffffe;
                      }
                    }
                  }
                }
              }
              else {
LAB_00111182:
                uVar7 = 0xfffffffffffffffe;
                cVar1 = cVar6;
              }
            }
          }
          else {
            *len = 1;
            uVar7 = uVar10;
            cVar1 = cVar6;
          }
        }
      }
    }
    if ((cVar1 != '\x03') && (cVar1 != '\0')) {
      return uVar7;
    }
    lVar9 = *pos;
    uVar3 = uVar7;
    if ((long)uVar8 <= lVar9 && -1 < (long)uVar8) {
      return 0;
    }
  }
LAB_00111381:
  *len = 1;
  return -3;
}

Assistant:

long Cluster::HasBlockEntries(
    const Segment* pSegment,
    long long off,  // relative to start of segment payload
    long long& pos, long& len) {
  assert(pSegment);
  assert(off >= 0);  // relative to segment

  IMkvReader* const pReader = pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = pSegment->m_start + off;  // absolute

  if ((total >= 0) && (pos >= total))
    return 0;  // we don't even have a complete cluster

  const long long segment_stop =
      (pSegment->m_size < 0) ? -1 : pSegment->m_start + pSegment->m_size;

  long long cluster_stop = -1;  // interpreted later to mean "unknown size"

  {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id != libwebm::kMkvCluster)
      return E_PARSE_FAILED;

    pos += len;  // consume Cluster ID field

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    if (size == 0)
      return 0;  // cluster does not have entries

    pos += len;  // consume size field

    // pos now points to start of payload

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size != unknown_size) {
      cluster_stop = pos + size;
      assert(cluster_stop >= 0);

      if ((segment_stop >= 0) && (cluster_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((total >= 0) && (cluster_stop > total))
        // return E_FILE_FORMAT_INVALID;  //too conservative
        return 0;  // cluster does not have any entries
    }
  }

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return 0;  // no entries detected

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      return 0;  // no entries found

    if (id == libwebm::kMkvCues)
      return 0;  // no entries found

    pos += len;  // consume id field

    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // underflow
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of payload

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;  // not supported inside cluster

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvBlockGroup)
      return 1;  // have at least one entry

    if (id == libwebm::kMkvSimpleBlock)
      return 1;  // have at least one entry

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }
}